

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionDefinition.cpp
# Opt level: O0

void __thiscall Shell::FunctionDefinitionExtra::output(FunctionDefinitionExtra *this,ostream *out)

{
  bool bVar1;
  reference ppTVar2;
  ostream *in_RSI;
  long in_RDI;
  Term *t;
  const_iterator __end1;
  const_iterator __begin1;
  vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_> *__range1;
  bool first;
  undefined1 in_stack_00000277;
  Term *in_stack_00000278;
  vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_> *in_stack_ffffffffffffff78;
  ostream *in_stack_ffffffffffffff80;
  string local_58 [32];
  Term *local_38;
  Term **local_30;
  __normal_iterator<Kernel::Term_*const_*,_std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>_>
  local_28;
  long local_20;
  byte local_11;
  ostream *local_10;
  
  local_11 = 1;
  local_10 = in_RSI;
  std::operator<<(in_RSI,"inlined=[");
  local_20 = in_RDI + 8;
  local_28._M_current =
       (Term **)std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>::begin
                          (in_stack_ffffffffffffff78);
  local_30 = (Term **)std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>::end
                                (in_stack_ffffffffffffff78);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<Kernel::Term_*const_*,_std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>_>
                        *)in_stack_ffffffffffffff80,
                       (__normal_iterator<Kernel::Term_*const_*,_std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>_>
                        *)in_stack_ffffffffffffff78);
    if (!bVar1) break;
    ppTVar2 = __gnu_cxx::
              __normal_iterator<Kernel::Term_*const_*,_std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>_>
              ::operator*(&local_28);
    local_38 = *ppTVar2;
    if ((local_11 & 1) == 0) {
      std::operator<<(local_10,",");
    }
    local_11 = 0;
    in_stack_ffffffffffffff80 = local_10;
    Kernel::Term::toString_abi_cxx11_(in_stack_00000278,(bool)in_stack_00000277);
    std::operator<<(in_stack_ffffffffffffff80,local_58);
    std::__cxx11::string::~string(local_58);
    __gnu_cxx::
    __normal_iterator<Kernel::Term_*const_*,_std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>_>
    ::operator++(&local_28);
  }
  std::operator<<(local_10,"]");
  return;
}

Assistant:

void FunctionDefinitionExtra::output(std::ostream &out) const {
  bool first = true;
  out << "inlined=[";
  for(Term *t : lhs) {
    if(!first)
      out << ",";
    first = false;
    out << t->toString();
  }
  out << "]";
}